

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * cmTarget::GetFileSetsPropertyName(string *__return_storage_ptr__,string *type)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "HEADER_SETS";
    pcVar2 = "";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)type);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar1 == 0) {
      pcVar3 = "CXX_MODULE_SETS";
      pcVar2 = "";
    }
    else {
      pcVar2 = "";
      pcVar3 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetFileSetsPropertyName(const std::string& type)
{
  if (type == "HEADERS") {
    return "HEADER_SETS";
  }
  if (type == "CXX_MODULES") {
    return "CXX_MODULE_SETS";
  }
  return "";
}